

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void reset(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  string local_168 [32];
  string local_148 [32];
  undefined1 local_128 [8];
  vector<DiffLine,_std::allocator<DiffLine>_> result;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string destination;
  allocator local_39;
  string local_38 [8];
  string source;
  char **argv_local;
  int argc_local;
  
  if (argc < 1) {
    printf("add need 1 or more arguments\n");
  }
  else {
    pcVar3 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar3,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::operator+(local_90,STAGE_DIR_abi_cxx11_);
    std::operator+(local_70,local_90);
    std::__cxx11::string::~string((string *)local_90);
    last_commit_hash_abi_cxx11_();
    hashToDir(local_f0);
    std::operator+(local_d0,(char *)local_f0);
    std::operator+(local_b0,local_d0);
    std::__cxx11::string::operator=(local_38,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string
              ((string *)
               &result.super__Vector_base<DiffLine,_std::allocator<DiffLine>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = file_exists(pcVar3);
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = file_exists(pcVar3);
      if (!bVar1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = creat(pcVar3,0x1ff);
        if (iVar2 == -1) {
          perror("creat");
          exit(1);
        }
      }
      std::__cxx11::string::string(local_148,local_38);
      std::__cxx11::string::string(local_168,(string *)local_70);
      diff_files((vector<DiffLine,_std::allocator<DiffLine>_> *)local_128,(string *)local_148,
                 (string *)local_168);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_148);
      sVar4 = std::vector<DiffLine,_std::allocator<DiffLine>_>::size
                        ((vector<DiffLine,_std::allocator<DiffLine>_> *)local_128);
      if (sVar4 == 0) {
        printf("Nothing to reset\n");
      }
      else {
        dst = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
        src = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
        copy(dst,src);
      }
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
                ((vector<DiffLine,_std::allocator<DiffLine>_> *)local_128);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = file_exists(pcVar3);
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        unlink(pcVar3);
      }
      else {
        printf("Nothing to reset\n");
      }
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void reset(int argc, char *argv[]){
    if(argc < 1){
        printf("add need 1 or more arguments\n");
    }
    else{
        String source = argv[0];
        String destination = STAGE_DIR + "/" + source;
        source = hashToDir(last_commit_hash()) + "/" + source;
        if(file_exists(source.c_str())){
            if(!file_exists(destination.c_str())){
                if(creat(destination.c_str(),DEFAULT_PERM)==-1){
                    perror("creat");
                    exit(EXIT_FAILURE);
                }
            }
            Vector<DiffLine> result = diff_files(source,destination);
            if(result.size()>0){
                copy(source.c_str(),destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
        else{
            if(file_exists(destination.c_str())){
                unlink(destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
    }
}